

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

int SUNDlsMat_denseORMQR
              (realtype **a,sunindextype m,sunindextype n,realtype *beta,realtype *vn,realtype *vm,
              realtype *v)

{
  double dVar1;
  realtype *prVar2;
  int iVar3;
  sunindextype j;
  sunindextype i;
  realtype s;
  realtype *col_j;
  realtype *vm_local;
  realtype *vn_local;
  realtype *beta_local;
  sunindextype n_local;
  sunindextype m_local;
  realtype **a_local;
  
  for (i = 0; iVar3 = n, i < n; i = i + 1) {
    vm[i] = vn[i];
  }
  while (i = iVar3, i < m) {
    vm[i] = 0.0;
    iVar3 = i + 1;
  }
  for (j = n + -1; -1 < j; j = j + -1) {
    prVar2 = a[j];
    *v = 1.0;
    s = vm[j];
    for (i = 1; i < m - j; i = i + 1) {
      v[i] = prVar2[i + j];
      s = v[i] * vm[i + j] + s;
    }
    dVar1 = beta[j];
    for (i = 0; i < m - j; i = i + 1) {
      vm[i + j] = -(dVar1 * s) * v[i] + vm[i + j];
    }
  }
  return 0;
}

Assistant:

int SUNDlsMat_denseORMQR(realtype **a, sunindextype m, sunindextype n, realtype *beta,
                         realtype *vn, realtype *vm, realtype *v)
{
  realtype *col_j, s;
  sunindextype i, j;

  /* Initialize vm */
  for(i=0; i<n; i++) vm[i] = vn[i];
  for(i=n; i<m; i++) vm[i] = ZERO;

  /* Accumulate (backwards) corrections into vm */
  for(j=n-1; j>=0; j--) {

    col_j = a[j];

    v[0] = ONE;
    s = vm[j];
    for(i=1; i<m-j; i++) {
      v[i] = col_j[i+j];
      s += v[i]*vm[i+j];
    }
    s *= beta[j];

    for(i=0; i<m-j; i++) vm[i+j] -= s * v[i];

  }

  return(0);
}